

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O0

string * __thiscall EvalString::Unparse_abi_cxx11_(string *__return_storage_ptr__,EvalString *this)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator cStack_30;
  bool special;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>_>
  local_28;
  const_iterator i;
  EvalString *this_local;
  string *result;
  
  i._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::begin(&this->parsed_);
  while( true ) {
    cStack_30 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ::end(&this->parsed_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>_>
             ::operator->(&local_28);
    bVar1 = ppVar2->second == SPECIAL;
    if (bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>_>
    ::operator->(&local_28);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>_>
    ::operator++(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

string EvalString::Unparse() const {
  string result;
  for (TokenList::const_iterator i = parsed_.begin();
       i != parsed_.end(); ++i) {
    bool special = (i->second == SPECIAL);
    if (special)
      result.append("${");
    result.append(i->first);
    if (special)
      result.append("}");
  }
  return result;
}